

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSetLayout.cpp
# Opt level: O0

void __thiscall
myvk::DescriptorBindingFlagGroup::Initialize
          (DescriptorBindingFlagGroup *this,
          vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>
          *binding_flags)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator __x;
  vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>
  *in_RDI;
  pair<VkDescriptorSetLayoutBinding,_unsigned_int> *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>
  *__range1;
  reference in_stack_ffffffffffffffd0;
  
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::clear
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             0x2d76cc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2d76d9);
  this_00 = std::
            vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>
            ::begin(in_RDI);
  __x = std::
        vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>
        ::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_*,_std::vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>_>
                      ((__normal_iterator<const_std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_*,_std::vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_*,_std::vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_*,_std::vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>_>
         ::operator*((__normal_iterator<const_std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_*,_std::vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>_>
                      *)&stack0xffffffffffffffe0);
    std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::
    push_back((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *
              )this_00._M_current,&(__x._M_current)->first);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00._M_current,
               (value_type_conflict2 *)__x._M_current);
    __gnu_cxx::
    __normal_iterator<const_std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_*,_std::vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_*,_std::vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void DescriptorBindingFlagGroup::Initialize(
    const std::vector<std::pair<VkDescriptorSetLayoutBinding, VkDescriptorBindingFlags>> &binding_flags) {
	m_bindings.clear();
	m_flags.clear();
	for (const auto &i : binding_flags) {
		m_bindings.push_back(i.first);
		m_flags.push_back(i.second);
	}
}